

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_detect_idle_stream(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  iVar1 = nghttp2_session_is_my_stream_id(session,stream_id);
  if (iVar1 == 0) {
    iVar1 = session_is_new_peer_stream_id(session,stream_id);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
    else {
      session_local._4_4_ = 1;
    }
  }
  else if (session->last_sent_stream_id < stream_id) {
    session_local._4_4_ = 1;
  }
  else {
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

static int session_detect_idle_stream(nghttp2_session *session,
                                      int32_t stream_id) {
  /* Assume that stream object with stream_id does not exist */
  if (nghttp2_session_is_my_stream_id(session, stream_id)) {
    if (session->last_sent_stream_id < stream_id) {
      return 1;
    }
    return 0;
  }
  if (session_is_new_peer_stream_id(session, stream_id)) {
    return 1;
  }
  return 0;
}